

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O1

void ScalePlane(uint8_t *src,int src_stride,int src_width,int src_height,uint8_t *dst,int dst_stride
               ,int dst_width,int dst_height,FilterMode filtering)

{
  uint8_t *puVar1;
  int iVar2;
  code *pcVar3;
  FilterMode filtering_00;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  code *pcVar9;
  uint8_t *puVar10;
  code *UNRECOVERED_JUMPTABLE;
  void *__s;
  uint8_t *puVar11;
  FilterMode in_stack_ffffffffffffff48;
  int local_64;
  void *local_60;
  long local_58;
  size_t local_50;
  code *local_48;
  int local_3c;
  int dx;
  int x;
  
  puVar11 = (uint8_t *)0x148dde;
  filtering_00 = ScaleFilterReduce(src_width,src_height,dst_width,dst_height,filtering);
  iVar4 = src_height;
  if (src_height < 0) {
    iVar4 = -src_height;
    src = src + ~src_height * src_stride;
    src_stride = -src_stride;
  }
  if (iVar4 == dst_height && dst_width == src_width) {
    CopyPlane(src,src_stride,dst,dst_stride,dst_width,dst_height);
    return;
  }
  if (filtering_00 != kFilterBox && dst_width == src_width) {
    iVar5 = FixedDiv_X86(iVar4,dst_height);
    ScalePlaneVertical(iVar4,dst_width,dst_height,src_stride,dst_stride,src,dst,0,0,iVar5,1,
                       filtering_00);
    return;
  }
  uVar8 = -src_width;
  if (0 < src_width) {
    uVar8 = src_width;
  }
  if (dst_height <= iVar4 && dst_width <= (int)uVar8) {
    if ((dst_width * 4 == src_width * 3) && (dst_height * 4 == iVar4 * 3)) {
      iVar4 = 0;
      if (filtering_00 != kFilterLinear) {
        iVar4 = src_stride;
      }
      if (filtering_00 == kFilterNone) {
        UNRECOVERED_JUMPTABLE = ScaleRowDown34_C;
        pcVar9 = ScaleRowDown34_C;
      }
      else {
        UNRECOVERED_JUMPTABLE = ScaleRowDown34_0_Box_C;
        pcVar9 = ScaleRowDown34_1_Box_C;
      }
      uVar8 = cpu_info_;
      if (cpu_info_ == 0) {
        uVar8 = InitCpuFlags();
      }
      if ((uVar8 & 0x40) != 0) {
        if (filtering_00 == kFilterNone) {
          UNRECOVERED_JUMPTABLE = ScaleRowDown34_Any_SSSE3;
          pcVar9 = ScaleRowDown34_Any_SSSE3;
        }
        else {
          UNRECOVERED_JUMPTABLE = ScaleRowDown34_0_Box_Any_SSSE3;
          pcVar9 = ScaleRowDown34_1_Box_Any_SSSE3;
        }
        if ((dst_width * -0x55555555 + 0x2aaaaaa8U >> 3 | dst_width * 0x60000000) < 0xaaaaaab) {
          if (filtering_00 == kFilterNone) {
            UNRECOVERED_JUMPTABLE = ScaleRowDown34_SSSE3;
            pcVar9 = ScaleRowDown34_SSSE3;
          }
          else {
            UNRECOVERED_JUMPTABLE = ScaleRowDown34_0_Box_SSSE3;
            pcVar9 = ScaleRowDown34_1_Box_SSSE3;
          }
        }
      }
      if (2 < dst_height) {
        local_48 = (code *)(long)src_stride;
        local_50 = (size_t)-iVar4;
        local_58 = (long)(src_stride * 2);
        local_60 = (void *)((long)local_48 * 3);
        iVar5 = 0;
        puVar11 = src;
        do {
          (*UNRECOVERED_JUMPTABLE)(puVar11,(long)iVar4,dst,dst_width);
          pcVar3 = local_48;
          puVar1 = puVar11 + (long)local_48;
          puVar10 = dst + dst_stride;
          (*pcVar9)(puVar1,(long)iVar4,puVar10,dst_width);
          src = puVar1 + local_58 + (long)pcVar3;
          (*UNRECOVERED_JUMPTABLE)(puVar11 + (long)local_60,local_50,puVar10 + dst_stride,dst_width)
          ;
          dst = puVar10 + dst_stride + dst_stride;
          iVar5 = iVar5 + 3;
          puVar11 = src;
        } while (iVar5 < dst_height + -2);
      }
      if (dst_height % 3 != 1) {
        if (dst_height % 3 != 2) {
          return;
        }
        (*UNRECOVERED_JUMPTABLE)(src,(long)iVar4,dst,dst_width);
        src = src + src_stride;
        dst = dst + dst_stride;
        UNRECOVERED_JUMPTABLE = pcVar9;
      }
      (*UNRECOVERED_JUMPTABLE)(src,0,dst,dst_width);
      return;
    }
    if (dst_height * 2 == iVar4 && dst_width * 2 == src_width) {
      if (filtering_00 == kFilterLinear) {
        UNRECOVERED_JUMPTABLE = ScaleRowDown2Linear_C;
      }
      else {
        UNRECOVERED_JUMPTABLE = ScaleRowDown2Box_C;
      }
      iVar4 = 0;
      if (filtering_00 == kFilterNone) {
        UNRECOVERED_JUMPTABLE = ScaleRowDown2_C;
        iVar4 = src_stride;
      }
      uVar8 = cpu_info_;
      if (cpu_info_ == 0) {
        uVar8 = InitCpuFlags();
      }
      if ((uVar8 & 0x40) != 0) {
        if (filtering_00 == kFilterLinear) {
          UNRECOVERED_JUMPTABLE = ScaleRowDown2Linear_Any_SSSE3;
        }
        else {
          UNRECOVERED_JUMPTABLE = ScaleRowDown2Box_Any_SSSE3;
        }
        if (filtering_00 == kFilterNone) {
          UNRECOVERED_JUMPTABLE = ScaleRowDown2_Any_SSSE3;
        }
        if ((dst_width & 0xfU) == 0) {
          if (filtering_00 == kFilterLinear) {
            UNRECOVERED_JUMPTABLE = ScaleRowDown2Linear_SSSE3;
          }
          else {
            UNRECOVERED_JUMPTABLE = ScaleRowDown2Box_SSSE3;
          }
          if (filtering_00 == kFilterNone) {
            UNRECOVERED_JUMPTABLE = ScaleRowDown2_SSSE3;
          }
        }
      }
      uVar8 = cpu_info_;
      if (cpu_info_ == 0) {
        uVar8 = InitCpuFlags();
      }
      if ((uVar8 >> 10 & 1) != 0) {
        if (filtering_00 == kFilterLinear) {
          UNRECOVERED_JUMPTABLE = ScaleRowDown2Linear_Any_AVX2;
        }
        else {
          UNRECOVERED_JUMPTABLE = ScaleRowDown2Box_Any_AVX2;
        }
        if (filtering_00 == kFilterNone) {
          UNRECOVERED_JUMPTABLE = ScaleRowDown2_Any_AVX2;
        }
        if ((dst_width & 0x1fU) == 0) {
          if (filtering_00 == kFilterLinear) {
            UNRECOVERED_JUMPTABLE = ScaleRowDown2Linear_AVX2;
          }
          else {
            UNRECOVERED_JUMPTABLE = ScaleRowDown2Box_AVX2;
          }
          if (filtering_00 == kFilterNone) {
            UNRECOVERED_JUMPTABLE = ScaleRowDown2_AVX2;
          }
        }
      }
      if (dst_height < 1) {
        return;
      }
      puVar11 = src + iVar4;
      iVar4 = 0;
      if (kFilterLinear < filtering_00) {
        iVar4 = src_stride;
      }
      do {
        (*UNRECOVERED_JUMPTABLE)(puVar11,(long)iVar4,dst,dst_width);
        puVar11 = puVar11 + src_stride * 2;
        dst = dst + dst_stride;
        dst_height = dst_height + -1;
      } while (dst_height != 0);
      return;
    }
    if ((dst_width * 8 == src_width * 3) && (dst_height * 8 == iVar4 * 3)) {
      libyuv::ScalePlaneDown38
                (dst_width,dst_height,src_stride,dst_stride,(int)src,(int)dst,
                 (uint8_t *)(ulong)filtering_00,puVar11,in_stack_ffffffffffffff48);
      return;
    }
    if (dst_height * 4 == iVar4 && dst_width * 4 == src_width) {
      if ((filtering_00 == kFilterBox) || (filtering_00 == kFilterNone)) {
        libyuv::ScalePlaneDown4
                  (dst_width,dst_height,src_stride,dst_stride,(int)src,(int)dst,
                   (uint8_t *)(ulong)filtering_00,puVar11,in_stack_ffffffffffffff48);
        return;
      }
      goto LAB_00149203;
    }
  }
  if (dst_height * 2 < iVar4 && filtering_00 == kFilterBox) {
    x = 0;
    local_64 = 0;
    dx = 0;
    local_3c = 0;
    ScaleSlope(src_width,iVar4,dst_width,dst_height,kFilterBox,&x,&local_64,&dx,&local_3c);
    local_60 = malloc((ulong)(uVar8 * 2 + 0x3f));
    UNRECOVERED_JUMPTABLE = libyuv::ScaleAddCols1_C;
    if (dx == 0x10000) {
      UNRECOVERED_JUMPTABLE = libyuv::ScaleAddCols0_C;
    }
    local_48 = libyuv::ScaleAddCols2_C;
    if ((short)dx == 0) {
      local_48 = UNRECOVERED_JUMPTABLE;
    }
    uVar6 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar6 = InitCpuFlags();
    }
    if ((uVar8 & 0xf) == 0) {
      UNRECOVERED_JUMPTABLE = ScaleAddRow_SSE2;
    }
    else {
      UNRECOVERED_JUMPTABLE = ScaleAddRow_Any_SSE2;
    }
    if ((uVar6 & 0x20) == 0) {
      UNRECOVERED_JUMPTABLE = ScaleAddRow_C;
    }
    uVar6 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar6 = InitCpuFlags();
    }
    if ((uVar8 & 0x1f) == 0) {
      pcVar9 = ScaleAddRow_AVX2;
    }
    else {
      pcVar9 = ScaleAddRow_Any_AVX2;
    }
    if ((uVar6 >> 10 & 1) == 0) {
      pcVar9 = UNRECOVERED_JUMPTABLE;
    }
    if (0 < dst_height) {
      __s = (void *)((long)local_60 + 0x3fU & 0xffffffffffffffc0);
      local_50 = (size_t)(uVar8 * 2);
      local_58 = (long)dst_stride;
      iVar5 = 0;
      do {
        iVar7 = local_64 >> 0x10;
        local_64 = local_64 + local_3c;
        puVar11 = src + iVar7 * src_stride;
        if (iVar4 << 0x10 <= local_64) {
          local_64 = iVar4 << 0x10;
        }
        iVar7 = (local_64 >> 0x10) - iVar7;
        memset(__s,0,local_50);
        iVar2 = iVar7;
        if (iVar7 < 2) {
          iVar7 = 1;
          iVar2 = 1;
        }
        do {
          (*pcVar9)(puVar11,__s,uVar8);
          puVar11 = puVar11 + src_stride;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        (*local_48)(dst_width,iVar2,x,dx,__s,dst);
        dst = dst + local_58;
        iVar5 = iVar5 + 1;
      } while (iVar5 != dst_height);
    }
    free(local_60);
    return;
  }
LAB_00149203:
  if (filtering_00 == kFilterNone || dst_height <= iVar4) {
    if (filtering_00 == kFilterNone) {
      libyuv::ScalePlaneSimple(src_width,iVar4,dst_width,dst_height,src_stride,dst_stride,src,dst);
    }
    else {
      ScalePlaneBilinearDown
                (src_width,iVar4,dst_width,dst_height,src_stride,dst_stride,src,dst,filtering_00);
    }
  }
  else {
    ScalePlaneBilinearUp
              (src_width,iVar4,dst_width,dst_height,src_stride,dst_stride,src,dst,filtering_00);
  }
  return;
}

Assistant:

LIBYUV_API
void ScalePlane(const uint8_t* src,
                int src_stride,
                int src_width,
                int src_height,
                uint8_t* dst,
                int dst_stride,
                int dst_width,
                int dst_height,
                enum FilterMode filtering) {
  // Simplify filtering when possible.
  filtering = ScaleFilterReduce(src_width, src_height, dst_width, dst_height,
                                filtering);

  // Negative height means invert the image.
  if (src_height < 0) {
    src_height = -src_height;
    src = src + (src_height - 1) * src_stride;
    src_stride = -src_stride;
  }

  // Use specialized scales to improve performance for common resolutions.
  // For example, all the 1/2 scalings will use ScalePlaneDown2()
  if (dst_width == src_width && dst_height == src_height) {
    // Straight copy.
    CopyPlane(src, src_stride, dst, dst_stride, dst_width, dst_height);
    return;
  }
  if (dst_width == src_width && filtering != kFilterBox) {
    int dy = FixedDiv(src_height, dst_height);
    // Arbitrary scale vertically, but unscaled horizontally.
    ScalePlaneVertical(src_height, dst_width, dst_height, src_stride,
                       dst_stride, src, dst, 0, 0, dy, 1, filtering);
    return;
  }
  if (dst_width <= Abs(src_width) && dst_height <= src_height) {
    // Scale down.
    if (4 * dst_width == 3 * src_width && 4 * dst_height == 3 * src_height) {
      // optimized, 3/4
      ScalePlaneDown34(src_width, src_height, dst_width, dst_height, src_stride,
                       dst_stride, src, dst, filtering);
      return;
    }
    if (2 * dst_width == src_width && 2 * dst_height == src_height) {
      // optimized, 1/2
      ScalePlaneDown2(src_width, src_height, dst_width, dst_height, src_stride,
                      dst_stride, src, dst, filtering);
      return;
    }
    // 3/8 rounded up for odd sized chroma height.
    if (8 * dst_width == 3 * src_width && 8 * dst_height == 3 * src_height) {
      // optimized, 3/8
      ScalePlaneDown38(src_width, src_height, dst_width, dst_height, src_stride,
                       dst_stride, src, dst, filtering);
      return;
    }
    if (4 * dst_width == src_width && 4 * dst_height == src_height &&
        (filtering == kFilterBox || filtering == kFilterNone)) {
      // optimized, 1/4
      ScalePlaneDown4(src_width, src_height, dst_width, dst_height, src_stride,
                      dst_stride, src, dst, filtering);
      return;
    }
  }
  if (filtering == kFilterBox && dst_height * 2 < src_height) {
    ScalePlaneBox(src_width, src_height, dst_width, dst_height, src_stride,
                  dst_stride, src, dst);
    return;
  }
  if (filtering && dst_height > src_height) {
    ScalePlaneBilinearUp(src_width, src_height, dst_width, dst_height,
                         src_stride, dst_stride, src, dst, filtering);
    return;
  }
  if (filtering) {
    ScalePlaneBilinearDown(src_width, src_height, dst_width, dst_height,
                           src_stride, dst_stride, src, dst, filtering);
    return;
  }
  ScalePlaneSimple(src_width, src_height, dst_width, dst_height, src_stride,
                   dst_stride, src, dst);
}